

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,optional<double> *target,string_view name,string_view value)

{
  _Storage<double,_true> _Var1;
  string_view value_00;
  string *in_RCX;
  _Storage<double,_true> *in_RDX;
  string *in_RDI;
  size_t in_R8;
  optional<double> oVar2;
  string_view in_stack_00000000;
  string *error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined7 uStack_37;
  string *psVar3;
  
  psVar3 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  value_00._M_str = (char *)psVar3;
  value_00._M_len = in_R8;
  oVar2 = parseDouble(in_stack_00000000,value_00,in_RCX);
  *in_RDX = oVar2.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
  _Var1._1_7_ = uStack_37;
  _Var1._0_1_ = oVar2.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_engaged;
  in_RDX[1] = _Var1;
  return in_RDI;
}

Assistant:

std::string CommandLine::Option::set(std::optional<double>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseDouble(name, value, error);
    return error;
}